

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O0

int __thiscall
ut11::detail::DeclareFixtureObj<AssertThatTests>::operator()<>
          (DeclareFixtureObj<AssertThatTests> *this,Category *category)

{
  AssertThatTests *this_00;
  pointer pAVar1;
  shared_ptr<ut11::detail::TestFixtureAbstract> local_c0;
  Category local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_> local_20;
  unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_> fixture;
  Category *category_local;
  DeclareFixtureObj<AssertThatTests> *this_local;
  
  fixture._M_t.super___uniq_ptr_impl<AssertThatTests,_std::default_delete<AssertThatTests>_>._M_t.
  super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
  super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl =
       (__uniq_ptr_data<AssertThatTests,_std::default_delete<AssertThatTests>,_true,_true>)
       (__uniq_ptr_data<AssertThatTests,_std::default_delete<AssertThatTests>,_true,_true>)category;
  this_00 = (AssertThatTests *)operator_new(0xf8);
  *(undefined8 *)&(this_00->caughtException).field_0x30 = 0;
  *(undefined8 *)&(this_00->caughtException).field_0x38 = 0;
  *(undefined8 *)&(this_00->caughtException).field_0x20 = 0;
  *(undefined8 *)&(this_00->caughtException).m_message = 0;
  *(undefined8 *)&(this_00->caughtException).field_0x10 = 0;
  *(undefined8 *)&(this_00->caughtException).field_0x18 = 0;
  (this_00->caughtException).m_line = 0;
  *(undefined8 *)&(this_00->caughtException).m_file = 0;
  *(undefined8 *)&this_00->field_0xa0 = 0;
  *(undefined8 *)&this_00->expectedValue = 0;
  *(undefined8 *)&this_00->field_0x90 = 0;
  *(undefined8 *)&this_00->field_0x98 = 0;
  *(undefined8 *)&this_00->field_0x80 = 0;
  *(undefined8 *)&this_00->message = 0;
  *(undefined8 *)&this_00->field_0x70 = 0;
  *(undefined8 *)&this_00->field_0x78 = 0;
  this_00->line = 0;
  *(undefined8 *)&this_00->file = 0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_categories._M_t._M_impl = 0;
  *(undefined8 *)
   &(this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x20 = 0;
  (this_00->super_TestFixture).m_StageBuilder._M_t.
  super___uniq_ptr_impl<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_ut11::detail::TestStageBuilder_*,_std::default_delete<ut11::detail::TestStageBuilder>_>
  .super__Head_base<0UL,_ut11::detail::TestStageBuilder_*,_false>._M_head_impl =
       (TestStageBuilder *)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x10 = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x18 = 0;
  (this_00->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_name = 0;
  *(undefined8 *)&(this_00->caughtException).field_0x40 = 0;
  AssertThatTests::AssertThatTests(this_00);
  std::unique_ptr<AssertThatTests,std::default_delete<AssertThatTests>>::
  unique_ptr<std::default_delete<AssertThatTests>,void>
            ((unique_ptr<AssertThatTests,std::default_delete<AssertThatTests>> *)&local_20,this_00);
  pAVar1 = std::unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_>::operator->
                     (&local_20);
  std::operator+(local_70,(char *)this);
  GetString_abi_cxx11_();
  std::operator+(local_50,local_70);
  TestFixture::SetName(&pAVar1->super_TestFixture,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_70);
  pAVar1 = std::unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_>::operator->
                     (&local_20);
  Category::Category(&local_b0,category);
  (*(pAVar1->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[2])
            (pAVar1,&local_b0);
  Category::~Category(&local_b0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::
  shared_ptr<AssertThatTests,std::default_delete<AssertThatTests>,void>(&local_c0,&local_20);
  PushFixture(&local_c0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::~shared_ptr(&local_c0);
  std::unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_>::~unique_ptr(&local_20);
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}